

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

Scal __thiscall LinearExpert::queryZ(LinearExpert *this,Z *z)

{
  Z *pZVar1;
  double *pdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Scalar SVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined8 uVar16;
  Index index;
  ulong uVar17;
  detail *pdVar18;
  ulong uVar19;
  Index index_5;
  long lVar20;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  plainobjectbase_evaluator_data<double,_0> pVar21;
  Index othersize;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  longdouble in_ST0;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  Z dzAux;
  Z aux2;
  scalar_sum_op<double,_double> local_101;
  double local_100;
  longdouble local_f8;
  double local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  plainobjectbase_evaluator_data<double,_0> local_c8;
  detail *local_c0;
  undefined1 local_b8 [16];
  plainobjectbase_evaluator_data<double,_0> local_a8;
  double *local_98;
  double local_90;
  Scal local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [32];
  double local_48;
  undefined8 uStack_40;
  
  pZVar1 = &this->dz;
  pdVar5 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar6 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar19,1);
    uVar19 = (this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar7 = (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar17 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      pdVar2 = pdVar5 + lVar20;
      pdVar4 = pdVar6 + lVar20;
      dVar12 = pdVar2[1] - pdVar4[1];
      auVar24._8_4_ = SUB84(dVar12,0);
      auVar24._0_8_ = *pdVar2 - *pdVar4;
      auVar24._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar7 + lVar20) = auVar24;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar19) {
    do {
      pdVar7[uVar17] = pdVar5[uVar17] - pdVar6[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  local_68._0_8_ = &this->Lambda;
  local_68._16_8_ = &this->Mu;
  local_68._8_8_ = pZVar1;
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)(local_b8 + 8),(XprType *)local_68);
  local_98 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68._16_8_)->
             m_storage).m_data;
  uVar19 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68._16_8_)->m_storage
           ).m_rows;
  if ((this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar19
               ,1);
    uVar19 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
  }
  pdVar5 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar17 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      dVar12 = ((double *)(local_b8._8_8_ + lVar20 * 8))[1] + (local_98 + lVar20)[1];
      auVar8._8_4_ = SUB84(dVar12,0);
      auVar8._0_8_ = *(double *)(local_b8._8_8_ + lVar20 * 8) + local_98[lVar20];
      auVar8._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar8;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar19) {
    do {
      pdVar5[uVar17] = *(double *)(local_b8._8_8_ + uVar17 * 8) + local_98[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  free(local_a8.data);
  local_100 = this->Sh;
  local_88 = this->wNu;
  local_e8 = this->wSigma + local_100;
  local_f8 = (longdouble)CONCAT28(local_f8._8_2_,(double)this->d);
  local_b8._0_8_ = &this->invSigma;
  local_b8._8_8_ = pZVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_b8);
  local_68._0_8_ = pZVar1;
  local_68._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8;
  if (local_c0 == (detail *)0x0) {
    local_c0 = (detail *)0x0;
    uVar22 = 0;
    uVar23 = 0;
  }
  else {
    local_b8._8_8_ =
         (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_a8.data = local_c8.data;
    SVar11 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_b8,(scalar_sum_op<double,_double> *)local_d8,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_68);
    uVar22 = SUB84(SVar11,0);
    uVar23 = (undefined4)((ulong)SVar11 >> 0x20);
  }
  pVar21.data = local_c8.data;
  local_90 = (double)CONCAT44(uVar23,uVar22);
  this->dz_invSigma_dz = (Scal)CONCAT44(uVar23,uVar22);
  local_48 = (double)this->d;
  uStack_40 = 0;
  if ((detail *)
      (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_c0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_c0,1);
    local_c0 = (detail *)
               (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
  }
  dVar26 = (local_e8 - local_f8._0_8_) + 1.0;
  local_e8 = (local_e8 + local_f8._0_8_ +
             *(double *)(&DAT_0018bd10 + (ulong)(-(uint)(local_88 == 0.0) & 1) * 8)) *
             ((local_100 + local_88 + 1.0) / (local_100 + local_88));
  dVar12 = local_90 / local_e8 + 1.0;
  dVar25 = ((local_48 + dVar26) / local_e8) / dVar12;
  pdVar5 = (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  pdVar18 = (detail *)((long)local_c0 - ((long)local_c0 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)local_c0) {
    lVar20 = 0;
    do {
      pdVar6 = pVar21.data + lVar20 * 8;
      dVar15 = pdVar6[1] * dVar25;
      auVar13._8_4_ = SUB84(dVar15,0);
      auVar13._0_8_ = *pdVar6 * dVar25;
      auVar13._12_4_ = (int)((ulong)dVar15 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar13;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)pdVar18);
  }
  if ((long)pdVar18 < (long)local_c0) {
    do {
      pdVar5[(long)pdVar18] = *(pVar21.data + (long)pdVar18 * 8) * dVar25;
      pdVar18 = pdVar18 + 1;
    } while (local_c0 != pdVar18);
  }
  local_f8 = (longdouble)CONCAT28(local_f8._8_2_,dVar26);
  dVar12 = pow(dVar12,((double)this->d + dVar26) * -0.5);
  this->rbf_z = dVar12;
  local_100 = this->sqrtDetInvSigma;
  local_70 = local_f8._0_8_ * 0.5;
  local_78 = (double)this->d * 0.5;
  boost::math::detail::
  tgamma_delta_ratio_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
            ((longdouble *)local_b8,local_c0,(longdouble)local_70,(longdouble)local_78,pol);
  local_f8 = in_ST0;
  if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
    boost::math::policies::detail::raise_error<std::overflow_error,double>
              ("boost::math::tgamma_delta_ratio<%1%>(%1%, %1%)","numeric overflow");
  }
  local_80 = (double)local_f8;
  local_100 = local_100 / local_80;
  dVar12 = pow(2.0 / local_e8,(double)this->d * 0.5);
  this->p_z_T = dVar12 * local_100 * this->rbf_z;
  uVar19 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_e8 = this->Sh;
  uStack_e0 = 0;
  local_d8._0_8_ = (Z *)0x0;
  local_d8._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8,uVar19,1);
  pdVar5 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar6 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (local_d8._8_8_ != uVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8,uVar19,1);
    uVar19 = local_d8._8_8_;
  }
  uVar17 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      pdVar7 = pdVar5 + lVar20;
      auVar9._8_4_ = SUB84(local_e8,0);
      auVar9._0_8_ = local_e8;
      auVar9._12_4_ = (int)((ulong)local_e8 >> 0x20);
      auVar24 = divpd(*(undefined1 (*) [16])(pdVar6 + lVar20),auVar9);
      dVar12 = pdVar7[1] - auVar24._8_8_;
      auVar14._8_4_ = SUB84(dVar12,0);
      auVar14._0_8_ = *pdVar7 - auVar24._0_8_;
      auVar14._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])
       (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8._0_8_)->m_storage).
         m_data + lVar20) = auVar14;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar19) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8._0_8_)->m_storage).
        m_data)[uVar17] = (double *)(pdVar5[uVar17] - pdVar6[uVar17] / local_e8);
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  local_68._0_8_ = &this->varLambda;
  local_68._8_8_ = (LhsNested)local_d8;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_b8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_68);
  uVar16 = local_b8._0_8_;
  pZVar1 = &this->dGamma;
  pVar21.data = (double *)local_b8._8_8_;
  if ((double *)
      (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != (double *)local_b8._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_b8._8_8_,1);
    pVar21.data = (double *)
                  (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
  }
  pdVar5 = (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar19 = (long)pVar21.data - ((long)pVar21.data >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)pVar21.data) {
    lVar20 = 0;
    do {
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar16)->m_storage)
                 .m_data + lVar20;
      dVar12 = (double)ppdVar3[1];
      pdVar6 = pdVar5 + lVar20;
      *pdVar6 = (double)*ppdVar3;
      pdVar6[1] = dVar12;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar19);
  }
  if ((long)uVar19 < (long)pVar21.data) {
    do {
      pdVar5[uVar19] =
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar16)->
                     m_storage).m_data)[uVar19];
      uVar19 = uVar19 + 1;
    } while (pVar21.data != (double *)uVar19);
  }
  free((void *)local_b8._0_8_);
  local_e8 = this->Sh;
  local_68._0_8_ = (LhsNested)local_d8;
  local_68._8_8_ = pZVar1;
  if ((this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar22 = 0;
    uVar23 = 0;
    uVar19 = 0;
  }
  else {
    local_b8._8_8_ = local_d8._0_8_;
    local_a8.data =
         (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar11 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_b8,&local_101,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_68);
    uVar22 = SUB84(SVar11,0);
    uVar23 = (undefined4)((ulong)SVar11 >> 0x20);
    uVar19 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
  }
  this->gamma = 1.0 / local_e8 + (double)CONCAT44(uVar23,uVar22);
  pdVar5 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar17 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      dVar25 = pdVar5[lVar20];
      dVar12 = (pdVar5 + lVar20)[1];
      dVar12 = dVar12 + dVar12;
      auVar10._8_4_ = SUB84(dVar12,0);
      auVar10._0_8_ = dVar25 + dVar25;
      auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar10;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar19) {
    do {
      pdVar5[uVar17] = pdVar5[uVar17] + pdVar5[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  local_e8 = this->p_z_T;
  free((void *)local_d8._0_8_);
  free(local_c8.data);
  return local_e8;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}